

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O2

void __thiscall
BamTools::Internal::BamStandardIndex::WriteBin
          (BamStandardIndex *this,uint32_t *binId,BaiAlignmentChunkVector *chunks)

{
  IBamIODevice *pIVar1;
  int iVar2;
  undefined4 extraout_var;
  BamException *this_00;
  allocator local_5e;
  allocator local_5d;
  uint32_t binKey;
  string local_58;
  string local_38;
  
  binKey = *binId;
  if (this->m_isBigEndian == true) {
    binKey = binKey >> 0x18 | (binKey & 0xff0000) >> 8 | (binKey & 0xff00) << 8 | binKey << 0x18;
  }
  pIVar1 = (this->m_resources).Device;
  iVar2 = (*pIVar1->_vptr_IBamIODevice[8])(pIVar1,&binKey,4);
  if (CONCAT44(extraout_var,iVar2) == 4) {
    WriteAlignmentChunks(this,chunks);
    return;
  }
  this_00 = (BamException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_38,"BamStandardIndex::WriteBin",&local_5d);
  std::__cxx11::string::string((string *)&local_58,"could not write bin ID",&local_5e);
  BamException::BamException(this_00,&local_38,&local_58);
  __cxa_throw(this_00,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BamStandardIndex::WriteBin(const uint32_t& binId, BaiAlignmentChunkVector& chunks)
{

    // write BAM bin ID
    uint32_t binKey = binId;
    if (m_isBigEndian) SwapEndian_32(binKey);
    const int64_t numBytesWritten = m_resources.Device->Write((const char*)&binKey, sizeof(binKey));
    if (numBytesWritten != sizeof(binKey))
        throw BamException("BamStandardIndex::WriteBin", "could not write bin ID");

    // write bin's alignment chunks
    WriteAlignmentChunks(chunks);
}